

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O1

cmLocalGenerator * __thiscall
cmGlobalGenerator::FindLocalGenerator(cmGlobalGenerator *this,string *start_dir)

{
  int iVar1;
  char *pcVar2;
  pointer ppcVar3;
  cmLocalGenerator *unaff_R15;
  bool bVar4;
  string sd;
  allocator local_51;
  long *local_50;
  size_t local_48;
  long local_40 [2];
  
  ppcVar3 = (this->LocalGenerators).
            super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppcVar3 !=
      (this->LocalGenerators).
      super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      pcVar2 = cmLocalGenerator::GetCurrentSourceDirectory(*ppcVar3);
      std::__cxx11::string::string((string *)&local_50,pcVar2,&local_51);
      if (local_48 == start_dir->_M_string_length) {
        if (local_48 == 0) {
          bVar4 = true;
        }
        else {
          iVar1 = bcmp(local_50,(start_dir->_M_dataplus)._M_p,local_48);
          bVar4 = iVar1 == 0;
        }
      }
      else {
        bVar4 = false;
      }
      if (bVar4) {
        unaff_R15 = *ppcVar3;
      }
      if (local_50 != local_40) {
        operator_delete(local_50,local_40[0] + 1);
      }
      if (bVar4) {
        return unaff_R15;
      }
      ppcVar3 = ppcVar3 + 1;
    } while (ppcVar3 !=
             (this->LocalGenerators).
             super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  return (cmLocalGenerator *)0x0;
}

Assistant:

void cmGlobalGenerator::FillExtensionToLanguageMap(const std::string& l,
                                                   cmMakefile* mf)
{
  std::string extensionsVar = std::string("CMAKE_") + std::string(l) +
    std::string("_SOURCE_FILE_EXTENSIONS");
  std::string exts = mf->GetSafeDefinition(extensionsVar);
  std::vector<std::string> extensionList;
  cmSystemTools::ExpandListArgument(exts, extensionList);
  for (std::vector<std::string>::iterator i = extensionList.begin();
       i != extensionList.end(); ++i) {
    this->ExtensionToLanguage[*i] = l;
  }
}